

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

void __thiscall
chaiscript::parser::ChaiScript_Parser::build_match<chaiscript::eval::Switch_AST_Node>
          (ChaiScript_Parser *this,size_t t_match_start,string *t_text)

{
  bool is_deep;
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  new_children;
  Parse_Location filepos;
  bool local_71;
  size_t local_70;
  shared_ptr<chaiscript::AST_Node> local_68;
  anon_class_24_3_3a5bb1e9 local_58;
  Parse_Location local_40;
  
  local_58.t_match_start = &local_70;
  local_58.is_deep = &local_71;
  local_71 = false;
  local_70 = t_match_start;
  local_58.this = this;
  build_match<chaiscript::eval::Switch_AST_Node>::anon_class_24_3_3a5bb1e9::operator()
            (&local_40,&local_58);
  local_58.is_deep = (bool *)0x0;
  local_58.t_match_start = (size_t *)0x0;
  local_58.this = (ChaiScript_Parser *)0x0;
  if (local_71 == true) {
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>
    ::
    _M_assign_aux<std::move_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<chaiscript::AST_Node>*,std::vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>>>>
              ((vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>
                *)&local_58,
               (this->m_match_stack).
               super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start + (int)local_70,
               (this->m_match_stack).
               super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
    ::erase(&this->m_match_stack,
            (this->m_match_stack).
            super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start + (int)local_70,
            (this->m_match_stack).
            super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
            ._M_impl.super__Vector_impl_data._M_finish);
  }
  make_shared<chaiscript::AST_Node,chaiscript::eval::Switch_AST_Node,std::__cxx11::string,chaiscript::Parse_Location,std::vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>>
            ((chaiscript *)&local_68,t_text,&local_40,
             (vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
              *)&local_58);
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>
  ::emplace_back<std::shared_ptr<chaiscript::AST_Node>>
            ((vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>
              *)&this->m_match_stack,&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ::~vector((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
             *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.filename.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void build_match(size_t t_match_start, std::string t_text = "") {
        bool is_deep = false;

        Parse_Location filepos = [&]()->Parse_Location{ 
          //so we want to take everything to the right of this and make them children
          if (t_match_start != m_match_stack.size()) {
            is_deep = true;
            return Parse_Location(
                m_filename,
                m_match_stack[t_match_start]->location.start.line,
                m_match_stack[t_match_start]->location.start.column,
                m_position.line,
                m_position.col 
              );
          } else {
            return Parse_Location(
                m_filename,
                m_position.line,
                m_position.col,
                m_position.line,
                m_position.col
              );
          }
        }();

        std::vector<AST_NodePtr> new_children;

        if (is_deep) {
          new_children.assign(std::make_move_iterator(m_match_stack.begin() + static_cast<int>(t_match_start)), 
                              std::make_move_iterator(m_match_stack.end()));
          m_match_stack.erase(m_match_stack.begin() + static_cast<int>(t_match_start), m_match_stack.end());
        }

        /// \todo fix the fact that a successful match that captured no ast_nodes doesn't have any real start position
        m_match_stack.push_back(
            chaiscript::make_shared<chaiscript::AST_Node, NodeType>(
              std::move(t_text),
              std::move(filepos),
              std::move(new_children)));
      }